

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

void uv__platform_invalidate_fd(uv_loop_t *loop,int fd)

{
  uv__io_t **ppuVar1;
  uint __line;
  int *piVar2;
  uv__io_t *puVar3;
  char *__assertion;
  bool bVar4;
  epoll_event dummy;
  
  ppuVar1 = loop->watchers;
  if (ppuVar1 == (uv__io_t **)0x0) {
    __assertion = "loop->watchers != NULL";
    __line = 0x37;
  }
  else {
    if (-1 < fd) {
      if (ppuVar1[loop->nwatchers] != (uv__io_t *)0x0) {
        puVar3 = ppuVar1[loop->nwatchers + 1];
        piVar2 = (int *)((long)&ppuVar1[loop->nwatchers]->cb + 4);
        while (bVar4 = puVar3 != (uv__io_t *)0x0, puVar3 = (uv__io_t *)&puVar3[-1].field_0x37, bVar4
              ) {
          if (*piVar2 == fd) {
            *piVar2 = -1;
          }
          piVar2 = piVar2 + 3;
        }
      }
      if (-1 < loop->backend_fd) {
        dummy.data.u64._4_4_ = 0;
        dummy._0_8_ = 0;
        epoll_ctl(loop->backend_fd,2,fd,(epoll_event *)&dummy);
      }
      return;
    }
    __assertion = "fd >= 0";
    __line = 0x38;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/epoll.c"
                ,__line,"void uv__platform_invalidate_fd(uv_loop_t *, int)");
}

Assistant:

void uv__platform_invalidate_fd(uv_loop_t* loop, int fd) {
  struct epoll_event* events;
  struct epoll_event dummy;
  uintptr_t i;
  uintptr_t nfds;

  assert(loop->watchers != NULL);
  assert(fd >= 0);

  events = (struct epoll_event*) loop->watchers[loop->nwatchers];
  nfds = (uintptr_t) loop->watchers[loop->nwatchers + 1];
  if (events != NULL)
    /* Invalidate events with same file descriptor */
    for (i = 0; i < nfds; i++)
      if (events[i].data.fd == fd)
        events[i].data.fd = -1;

  /* Remove the file descriptor from the epoll.
   * This avoids a problem where the same file description remains open
   * in another process, causing repeated junk epoll events.
   *
   * We pass in a dummy epoll_event, to work around a bug in old kernels.
   */
  if (loop->backend_fd >= 0) {
    /* Work around a bug in kernels 3.10 to 3.19 where passing a struct that
     * has the EPOLLWAKEUP flag set generates spurious audit syslog warnings.
     */
    memset(&dummy, 0, sizeof(dummy));
    epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &dummy);
  }
}